

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

void opj_worker_thread_function(void *user_data)

{
  opj_thread_pool_t *tp_00;
  opj_tls_t *tls_00;
  opj_worker_thread_job_t *ptr;
  opj_worker_thread_job_t *job;
  OPJ_BOOL job_finished;
  opj_tls_t *tls;
  opj_thread_pool_t *tp;
  opj_worker_thread_t *worker_thread;
  void *user_data_local;
  
  job._4_4_ = 0;
  tp_00 = *user_data;
  tls_00 = opj_tls_new();
  while( true ) {
    ptr = opj_thread_pool_get_next_job(tp_00,(opj_worker_thread_t *)user_data,job._4_4_);
    if (ptr == (opj_worker_thread_job_t *)0x0) break;
    if (ptr->job_fn != (opj_job_fn)0x0) {
      (*ptr->job_fn)(ptr->user_data,tls_00);
    }
    opj_free(ptr);
    job._4_4_ = 1;
  }
  opj_tls_destroy(tls_00);
  return;
}

Assistant:

static void opj_worker_thread_function(void* user_data)
{
    opj_worker_thread_t* worker_thread;
    opj_thread_pool_t* tp;
    opj_tls_t* tls;
    OPJ_BOOL job_finished = OPJ_FALSE;

    worker_thread = (opj_worker_thread_t*) user_data;
    tp = worker_thread->tp;
    tls = opj_tls_new();

    while (OPJ_TRUE) {
        opj_worker_thread_job_t* job = opj_thread_pool_get_next_job(tp, worker_thread,
                                       job_finished);
        if (job == NULL) {
            break;
        }

        if (job->job_fn) {
            job->job_fn(job->user_data, tls);
        }
        opj_free(job);
        job_finished = OPJ_TRUE;
    }

    opj_tls_destroy(tls);
}